

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CodeChangeCount(Vdbe *v,int regCounter,char *zColName)

{
  sqlite3VdbeAddOp3(v,0x53,0,0,0);
  sqlite3VdbeAddOp3(v,0x54,regCounter,1,0);
  sqlite3VdbeSetNumCols(v,1);
  if (v->db->mallocFailed != '\0') {
    return;
  }
  sqlite3VdbeMemSetStr(v->aColName,zColName,-1,'\x01',(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeChangeCount(Vdbe *v, int regCounter, const char *zColName){
  sqlite3VdbeAddOp0(v, OP_FkCheck);
  sqlite3VdbeAddOp2(v, OP_ResultRow, regCounter, 1);
  sqlite3VdbeSetNumCols(v, 1);
  sqlite3VdbeSetColName(v, 0, COLNAME_NAME, zColName, SQLITE_STATIC);
}